

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mac.c
# Opt level: O0

uint64_t * genMAC(MacCtx_t *mac_context,queue *in,queue *out)

{
  _Bool _Var1;
  chunk *pcVar2;
  bool bVar3;
  uint64_t *local_38;
  uint64_t *mac;
  chunk *update_chunk;
  queue *out_local;
  queue *in_local;
  MacCtx_t *mac_context_local;
  
  mac = (uint64_t *)0x0;
  local_38 = (uint64_t *)0x0;
  while( true ) {
    bVar3 = false;
    if (in != (queue *)0x0) {
      pcVar2 = front(in);
      bVar3 = false;
      if (pcVar2->action != '\x05') {
        pcVar2 = front(in);
        bVar3 = pcVar2->action != '\x06';
      }
    }
    if (!bVar3) break;
    if (mac == (uint64_t *)0x0) {
      mac = (uint64_t *)front(in);
      deque(in);
      if (((chunk *)mac)->action != '\x04') {
        perror("Bad data in mac queue aborting operation\n");
        destroyChunk((chunk *)mac);
        return (uint64_t *)0x0;
      }
      ((chunk *)mac)->action = mac_context->out_action;
      skeinUpdate(mac_context->skein_context_ptr,(uint8_t *)((chunk *)mac)->data,
                  ((chunk *)mac)->data_size);
    }
    if ((mac != (uint64_t *)0x0) && (_Var1 = enque((chunk *)mac,out), _Var1)) {
      mac = (uint64_t *)0x0;
    }
  }
  if (in != (queue *)0x0) {
    local_38 = (uint64_t *)calloc(mac_context->digest_byte_size,1);
    skeinFinal(mac_context->skein_context_ptr,(uint8_t *)local_38);
  }
  return local_38;
}

Assistant:

uint64_t* genMAC(MacCtx_t* mac_context, queue* in, queue* out)
{
    pdebug("genMAC()\n");

    chunk* update_chunk = NULL;
    uint64_t* mac = NULL;

    //iterate through the queue and generate a MAC for everything in it
    while(in != NULL && front(in)->action != DONE && front(in)->action != MAC)
    {
        //check if we are free to MAC a chunk if so do it
        if(update_chunk == NULL)
        {
            update_chunk = front(in);
            deque(in); //pop the 
            if(update_chunk->action != GEN_MAC) //sanity check
            {
                 perror("Bad data in mac queue aborting operation\n");
                 destroyChunk(update_chunk);
                 return NULL;
            }

            //set the chunk action to WRITE
            update_chunk->action = mac_context->out_action;
            skeinUpdate(mac_context->skein_context_ptr,
                        (const uint8_t*)update_chunk->data,
                        update_chunk->data_size);   
        }

        if(update_chunk != NULL && enque(update_chunk, out) == true) //attempt to queue the chunk
        {
            update_chunk = NULL;
            //Set mac chunk to NULL so the next chunk will be maced
        }
        //otherwise spin and wait for the queue to empty
    }

    if(in != NULL)
    {
        mac = calloc(mac_context->digest_byte_size, sizeof(uint8_t));
        skeinFinal(mac_context->skein_context_ptr, (uint8_t*)mac);
    } 
    
    return mac;
}